

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

float vkt::sr::anon_unknown_0::computeLodFromGradCube(ShaderEvalContext *c)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float t;
  float s;
  float d;
  float m;
  ShaderEvalContext *c_local;
  
  fVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar2 = de::abs<float>(fVar2);
  iVar1 = tcu::TextureCube::getSize(c->textures[0].texCube);
  fVar3 = (float)iVar1 / (fVar2 * 2.0);
  fVar2 = (float)iVar1 / (fVar2 * 2.0);
  fVar4 = tcu::Vector<float,_4>::x(c->in + 1);
  fVar5 = tcu::Vector<float,_4>::y(c->in + 1);
  fVar6 = tcu::Vector<float,_4>::x(c->in + 2);
  fVar7 = tcu::Vector<float,_4>::y(c->in + 2);
  fVar2 = TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,fVar4 * fVar3,fVar5 * fVar2,fVar6 * fVar3,fVar7 * fVar2);
  return fVar2;
}

Assistant:

inline float computeLodFromGradCube (const ShaderEvalContext& c)
{
	// \note Major axis is always -Z or +Z
	float m = de::abs(c.in[0].z());
	float d = (float)c.textures[0].texCube->getSize();
	float s = d/(2.0f*m);
	float t = d/(2.0f*m);
	return computeLodFromDerivates(DEFAULT_LOD_MODE, c.in[1].x()*s, c.in[1].y()*t, c.in[2].x()*s, c.in[2].y()*t);
}